

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_clnt.c
# Opt level: O1

_Bool rpcb_set(rpcprog_t program,rpcvers_t version,netconfig *nconf,netbuf *address)

{
  int32_t *piVar1;
  ushort uVar2;
  int iVar3;
  mem_format_t p_Var4;
  __uid_t _Var5;
  clnt_stat cVar6;
  CLIENT *pCVar7;
  clnt_req *cc;
  AUTH *pAVar8;
  char *pcVar9;
  uint16_t uVar10;
  clnt_stat __num;
  bool bVar11;
  byte bVar12;
  timespec timeout;
  bool_t rslt;
  RPCB parms;
  char uidbuf [32];
  int local_7c;
  rpcprog_t local_78;
  rpcvers_t local_74;
  char *local_70;
  char *local_68;
  char *local_60;
  char local_58 [40];
  
  local_7c = 0;
  if (nconf == (netconfig *)0x0) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      __num = RPC_UNKNOWNPROTO;
LAB_00114c07:
      p_Var4 = __ntirpc_pkg_params.warnx_;
      pcVar9 = clnt_sperrno(__num);
      bVar12 = 0;
      (*p_Var4)("%s: %s","rpcb_set",pcVar9);
      goto LAB_00114c24;
    }
  }
  else if (address == (netbuf *)0x0) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      __num = RPC_UNKNOWNADDR;
      goto LAB_00114c07;
    }
  }
  else {
    pCVar7 = local_rpcb("rpcb_set");
    if ((pCVar7->cl_error).re_status == RPC_SUCCESS) {
      local_68 = taddr2uaddr(nconf,address);
      if (local_68 != (char *)0x0) {
        local_70 = nconf->nc_netid;
        local_78 = program;
        local_74 = version;
        _Var5 = geteuid();
        snprintf(local_58,0x20,"%d",(ulong)_Var5);
        local_60 = local_58;
        cc = (clnt_req *)
             (*__ntirpc_pkg_params.malloc_)
                       (0x2e0,
                        "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpcb_clnt.c"
                        ,0x1cf,"rpcb_set");
        pAVar8 = authnone_ncreate();
        cc->cc_clnt = pCVar7;
        cc->cc_auth = pAVar8;
        cc->cc_proc = 1;
        (cc->cc_call).proc = xdr_rpcb;
        (cc->cc_call).where = &local_78;
        (cc->cc_reply).proc = xdr_bool;
        (cc->cc_reply).where = &local_7c;
        memcpy(&cc->cc_verf,&_null_auth,0x198);
        cc->cc_free_cb = (clnt_req_freer)__ntirpc_pkg_params.free_size_;
        cc->cc_size = 0x2e0;
        cc->cc_refcnt = 1;
        pthread_mutex_init((pthread_mutex_t *)&cc->cc_we,(pthread_mutexattr_t *)0x0);
        pthread_mutex_lock((pthread_mutex_t *)&cc->cc_we);
        pthread_cond_init((pthread_cond_t *)&(cc->cc_we).cv,(pthread_condattr_t *)0x0);
        timeout.tv_nsec = to.tv_nsec;
        timeout.tv_sec = to.tv_sec;
        cVar6 = clnt_req_setup(cc,timeout);
        if ((cVar6 != RPC_SUCCESS) || (cVar6 = clnt_req_wait_reply(cc), cVar6 != RPC_SUCCESS)) {
          pcVar9 = rpc_sperror(&cc->cc_error,"rpcb_set");
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s",pcVar9);
          }
          (*__ntirpc_pkg_params.free_size_)(pcVar9,0x100);
        }
        clnt_req_release(cc);
        uVar10 = pCVar7->cl_flags;
        do {
          LOCK();
          uVar2 = pCVar7->cl_flags;
          bVar11 = uVar10 == uVar2;
          if (bVar11) {
            pCVar7->cl_flags = uVar10 | 0x20;
            uVar2 = uVar10;
          }
          uVar10 = uVar2;
          UNLOCK();
        } while (!bVar11);
        if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s: %p %d @%s:%d","clnt_destroy_it",pCVar7,(ulong)(uint)pCVar7->cl_refcnt,
                     "rpcb_set",0x1df);
        }
        if ((uVar10 & 0x20) == 0) {
          LOCK();
          piVar1 = &pCVar7->cl_refcnt;
          iVar3 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
            (*__ntirpc_pkg_params.warnx_)
                      ("%s: %p %d @%s:%d","clnt_release_it",pCVar7,(ulong)(iVar3 - 1U),"rpcb_set",
                       0x1df);
          }
          if ((int)(iVar3 - 1U) < 1) {
            rpcb_set_cold_2();
          }
        }
        (*__ntirpc_pkg_params.free_size_)(local_68,0);
        bVar12 = local_7c != 0;
        goto LAB_00114c24;
      }
      uVar10 = pCVar7->cl_flags;
      do {
        LOCK();
        uVar2 = pCVar7->cl_flags;
        bVar11 = uVar10 == uVar2;
        if (bVar11) {
          pCVar7->cl_flags = uVar10 | 0x20;
          uVar2 = uVar10;
        }
        uVar10 = uVar2;
        UNLOCK();
      } while (!bVar11);
      if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p %d @%s:%d","clnt_destroy_it",pCVar7,(ulong)(uint)pCVar7->cl_refcnt,
                   "rpcb_set",0x1bf);
      }
      if ((uVar10 & 0x20) == 0) {
        LOCK();
        piVar1 = &pCVar7->cl_refcnt;
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s: %p %d @%s:%d","clnt_release_it",pCVar7,(ulong)(iVar3 - 1U),"rpcb_set",
                     0x1bf);
        }
        if ((int)(iVar3 - 1U) < 1) {
          rpcb_set_cold_3();
        }
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 4) != 0) {
        __num = RPC_N2AXLATEFAILURE;
        goto LAB_00114c07;
      }
    }
    else {
      uVar10 = pCVar7->cl_flags;
      do {
        LOCK();
        uVar2 = pCVar7->cl_flags;
        bVar11 = uVar10 == uVar2;
        if (bVar11) {
          pCVar7->cl_flags = uVar10 | 0x20;
          uVar2 = uVar10;
        }
        uVar10 = uVar2;
        UNLOCK();
      } while (!bVar11);
      if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p %d @%s:%d","clnt_destroy_it",pCVar7,(ulong)(uint)pCVar7->cl_refcnt,
                   "rpcb_set",0x1b6);
      }
      if ((uVar10 & 0x20) == 0) {
        LOCK();
        piVar1 = &pCVar7->cl_refcnt;
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
          (*__ntirpc_pkg_params.warnx_)
                    ("%s: %p %d @%s:%d","clnt_release_it",pCVar7,(ulong)(iVar3 - 1U),"rpcb_set",
                     0x1b6);
        }
        if ((int)(iVar3 - 1U) < 1) {
          rpcb_set_cold_1();
          bVar12 = (byte)local_78;
          goto LAB_00114c24;
        }
      }
    }
  }
  bVar12 = 0;
LAB_00114c24:
  return (_Bool)(bVar12 & 1);
}

Assistant:

bool
rpcb_set(rpcprog_t program, rpcvers_t version, const struct netconfig *nconf,
	 /* Network structure of transport */
	 const struct netbuf *address /* Services netconfig address */)
{
	CLIENT *client;
	struct clnt_req *cc;
	RPCB parms;
	char uidbuf[32];
	enum clnt_stat stat;
	bool_t rslt = false;	/* yes, bool_t */

	/* parameter checking */
	if (nconf == NULL) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s: %s",
			__func__, clnt_sperrno(RPC_UNKNOWNPROTO));
		return (false);
	}
	if (address == NULL) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s: %s",
			__func__, clnt_sperrno(RPC_UNKNOWNADDR));
		return (false);
	}
	client = local_rpcb(__func__);
	if (CLNT_FAILURE(client)) {
		CLNT_DESTROY(client);
		return (false);
	}

	/* convert to universal */
	/*LINTED const castaway */
	parms.r_addr =
	    taddr2uaddr((struct netconfig *)nconf, (struct netbuf *)address);
	if (!parms.r_addr) {
		CLNT_DESTROY(client);
		__warnx(TIRPC_DEBUG_FLAG_WARN, "%s: %s",
			__func__, clnt_sperrno(RPC_N2AXLATEFAILURE));
		return (false);	/* no universal address */
	}
	parms.r_prog = program;
	parms.r_vers = version;
	parms.r_netid = nconf->nc_netid;
	/*
	 * Though uid is not being used directly, we still send it for
	 * completeness.  For non-unix platforms, perhaps some other
	 * string or an empty string can be sent.
	 */
	(void)snprintf(uidbuf, sizeof(uidbuf), "%d", geteuid());
	parms.r_owner = uidbuf;

	cc = mem_alloc(sizeof(*cc));
	clnt_req_fill(cc, client, authnone_ncreate(), RPCBPROC_SET,
		      (xdrproc_t) xdr_rpcb, &parms,
		      (xdrproc_t) xdr_bool, &rslt);
	stat = clnt_req_setup(cc, to);
	if (stat == RPC_SUCCESS) {
		stat = CLNT_CALL_WAIT(cc);
	}
	if (stat != RPC_SUCCESS) {
		char *t = rpc_sperror(&cc->cc_error, __func__);

		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s", t);
		mem_free(t, RPC_SPERROR_BUFLEN);
	}

	clnt_req_release(cc);
	CLNT_DESTROY(client);
	mem_free(parms.r_addr, 0);
	return (rslt);
}